

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlGenerator.cpp
# Opt level: O0

void print(ostream *output,ScNameSet *deferrals)

{
  bool bVar1;
  reference pbVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *event;
  iterator __end2;
  iterator __begin2;
  ScNameSet *__range2;
  ScNameSet *deferrals_local;
  ostream *output_local;
  
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(deferrals);
  if (!bVar1) {
    std::operator<<(output,"  deferrals:\n");
    __end2 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(deferrals);
    event = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(deferrals);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&event), bVar1) {
      pbVar2 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
      poVar3 = std::operator<<(output,"    - ");
      poVar3 = std::operator<<(poVar3,(string *)pbVar2);
      std::operator<<(poVar3,"\n");
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

static void print(std::ostream &output, const ScNameSet &deferrals) noexcept
{
    if (!deferrals.empty()) {
        output << "  deferrals:\n";
        for (const auto &event : deferrals) {
            output << "    - " << event << "\n";
        }
    }
}